

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O2

void __thiscall QPDFObjectHandle::setArrayItem(QPDFObjectHandle *this,int n,QPDFObjectHandle *item)

{
  bool bVar1;
  Array array;
  allocator<char> local_59;
  string local_58;
  Array local_38;
  
  as_array(&local_38,this,strict);
  if (local_38.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"ignoring attempt to set item",&local_59);
    typeWarning(this,"array",&local_58);
  }
  else {
    bVar1 = ::qpdf::Array::setAt(&local_38,n,item);
    if (bVar1) goto LAB_001c3148;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"ignoring attempt to set out of bounds array item",&local_59);
    objectWarning(this,&local_58);
  }
  std::__cxx11::string::~string((string *)&local_58);
LAB_001c3148:
  ::qpdf::Array::~Array(&local_38);
  return;
}

Assistant:

void
QPDFObjectHandle::setArrayItem(int n, QPDFObjectHandle const& item)
{
    if (auto array = as_array(strict)) {
        if (!array.setAt(n, item)) {
            objectWarning("ignoring attempt to set out of bounds array item");
            QTC::TC("qpdf", "QPDFObjectHandle set array bounds");
        }
    } else {
        typeWarning("array", "ignoring attempt to set item");
        QTC::TC("qpdf", "QPDFObjectHandle array ignoring set item");
    }
}